

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_disconnect(Curl_easy *data,connectdata *conn,_Bool dead_connection)

{
  CURLcode CVar1;
  pop3_conn *pop3c;
  _Bool dead_connection_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((!dead_connection) && (((ulong)conn->bits >> 0xd & 1) != 0)) &&
     (CVar1 = pop3_perform_quit(data,conn), CVar1 == CURLE_OK)) {
    pop3_block_statemach(data,conn,true);
  }
  Curl_pp_disconnect(&(conn->proto).ftpc.pp);
  Curl_sasl_cleanup(conn,*(unsigned_short *)((long)&conn->proto + 0xdc));
  (*Curl_cfree)((void *)(conn->proto).imapc.dyn.toobig);
  (conn->proto).imapc.dyn.toobig = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode pop3_disconnect(struct Curl_easy *data,
                                struct connectdata *conn, bool dead_connection)
{
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  (void)data;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  if(!dead_connection && conn->bits.protoconnstart) {
    if(!pop3_perform_quit(data, conn))
      (void)pop3_block_statemach(data, conn, TRUE); /* ignore errors on QUIT */
  }

  /* Disconnect from the server */
  Curl_pp_disconnect(&pop3c->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, pop3c->sasl.authused);

  /* Cleanup our connection based variables */
  Curl_safefree(pop3c->apoptimestamp);

  return CURLE_OK;
}